

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatTextureHandle
pbrt::FloatTextureHandle::Create
          (string *name,Transform *renderFromTexture,TextureParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc,bool gpu)

{
  bool bVar1;
  FileLoc *in_RSI;
  Transform *in_RDI;
  Transform *in_R9;
  long *in_FS_OFFSET;
  Allocator unaff_retaddr;
  byte in_stack_00000008;
  FileLoc *in_stack_00000028;
  TextureParameterDictionary *in_stack_00000030;
  Transform *in_stack_00000038;
  Allocator in_stack_00000040;
  FileLoc *in_stack_00000048;
  TextureParameterDictionary *in_stack_00000050;
  Transform *in_stack_00000058;
  Allocator in_stack_00000060;
  Allocator in_stack_00000068;
  FileLoc *in_stack_000000b0;
  TextureParameterDictionary *in_stack_000000b8;
  Transform *in_stack_000000c0;
  Allocator in_stack_000000c8;
  FloatTextureHandle *tex;
  FileLoc *in_stack_00000268;
  TextureParameterDictionary *in_stack_00000270;
  Transform *in_stack_00000278;
  Allocator in_stack_00000280;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  __lhs;
  Transform *in_stack_ffffffffffffff08;
  Allocator in_stack_ffffffffffffff10;
  Allocator in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  Transform *in_stack_ffffffffffffff38;
  FileLoc *in_stack_ffffffffffffff40;
  FileLoc *in_stack_ffffffffffffff58;
  TextureParameterDictionary *in_stack_ffffffffffffff60;
  Transform *in_stack_ffffffffffffff68;
  Allocator in_stack_ffffffffffffff70;
  FileLoc *in_stack_ffffffffffffffa8;
  TextureParameterDictionary *in_stack_ffffffffffffffb0;
  Transform *in_stack_ffffffffffffffb8;
  Allocator in_stack_ffffffffffffffc0;
  Transform *renderFromTexture_00;
  
  __lhs.bits = (uintptr_t)in_RDI;
  renderFromTexture_00 = in_RDI;
  FloatTextureHandle((FloatTextureHandle *)0x4f9668);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs.bits,(char *)in_RDI);
  if (bVar1) {
    FloatConstantTexture::Create
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff70);
    TaggedPointer<pbrt::FloatConstantTexture>
              ((FloatTextureHandle *)__lhs.bits,(FloatConstantTexture *)in_RDI);
    operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs.bits,(char *)in_RDI);
    if (bVar1) {
      FloatScaledTexture::Create
                ((Transform *)in_stack_00000060.memoryResource,
                 (TextureParameterDictionary *)in_stack_00000058,(FileLoc *)in_stack_00000050,
                 in_stack_00000068);
      operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs.bits,(char *)in_RDI);
      if (bVar1) {
        FloatMixTexture::Create
                  (renderFromTexture_00,(TextureParameterDictionary *)in_R9,in_RSI,unaff_retaddr);
        TaggedPointer<pbrt::FloatMixTexture>
                  ((FloatTextureHandle *)__lhs.bits,(FloatMixTexture *)in_RDI);
        operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs.bits,(char *)in_RDI);
        if (bVar1) {
          FloatBilerpTexture::Create
                    (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000040);
          TaggedPointer<pbrt::FloatBilerpTexture>
                    ((FloatTextureHandle *)__lhs.bits,(FloatBilerpTexture *)in_RDI);
          operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs.bits,(char *)in_RDI);
          if (bVar1) {
            if ((in_stack_00000008 & 1) == 0) {
              FloatImageTexture::Create
                        (in_stack_00000278,in_stack_00000270,in_stack_00000268,in_stack_00000280);
              TaggedPointer<pbrt::FloatImageTexture>
                        ((FloatTextureHandle *)__lhs.bits,(FloatImageTexture *)in_RDI);
              operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
            }
            else {
              GPUFloatImageTexture::Create
                        (in_stack_ffffffffffffff08,(TextureParameterDictionary *)__lhs.bits,
                         (FileLoc *)in_RDI,in_stack_ffffffffffffff10);
              TaggedPointer<pbrt::GPUFloatImageTexture>
                        ((FloatTextureHandle *)__lhs.bits,(GPUFloatImageTexture *)in_RDI);
              operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs.bits,(char *)in_RDI);
            if (bVar1) {
              FloatCheckerboardTexture::Create
                        (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000c8);
              TaggedPointer<pbrt::FloatCheckerboardTexture>
                        ((FloatTextureHandle *)__lhs.bits,(FloatCheckerboardTexture *)in_RDI);
              operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs.bits,(char *)in_RDI);
              if (bVar1) {
                FloatDotsTexture::Create
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc0);
                TaggedPointer<pbrt::FloatDotsTexture>
                          ((FloatTextureHandle *)__lhs.bits,(FloatDotsTexture *)in_RDI);
                operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs.bits,(char *)in_RDI);
                if (bVar1) {
                  FBmTexture::Create(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc0);
                  TaggedPointer<pbrt::FBmTexture>
                            ((FloatTextureHandle *)__lhs.bits,(FBmTexture *)in_RDI);
                  operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
                  in_stack_ffffffffffffff38 = in_R9;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs.bits,(char *)in_RDI);
                  if (bVar1) {
                    WrinkledTexture::Create
                              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffc0);
                    TaggedPointer<pbrt::WrinkledTexture>
                              ((FloatTextureHandle *)__lhs.bits,(WrinkledTexture *)in_RDI);
                    operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs.bits,(char *)in_RDI);
                    if (bVar1) {
                      WindyTexture::Create
                                (in_R9,(TextureParameterDictionary *)
                                       in_stack_ffffffffffffff10.memoryResource,
                                 (FileLoc *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff20);
                      TaggedPointer<pbrt::WindyTexture>
                                ((FloatTextureHandle *)__lhs.bits,(WindyTexture *)in_RDI);
                      operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__lhs.bits,(char *)in_RDI);
                      if (!bVar1) {
                        ErrorExit<std::__cxx11::string_const&>
                                  (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                                   in_stack_ffffffffffffff30);
                      }
                      if ((in_stack_00000008 & 1) != 0) {
                        ErrorExit((FileLoc *)__lhs.bits,(char *)in_RDI);
                      }
                      FloatPtexTexture::Create
                                (in_stack_00000058,in_stack_00000050,in_stack_00000048,
                                 in_stack_00000060);
                      TaggedPointer<pbrt::FloatPtexTexture>
                                ((FloatTextureHandle *)__lhs.bits,(FloatPtexTexture *)in_RDI);
                      operator=((FloatTextureHandle *)__lhs.bits,(FloatTextureHandle *)in_RDI);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (bVar1) {
    *(long *)(*in_FS_OFFSET + -0x5a8) = *(long *)(*in_FS_OFFSET + -0x5a8) + 1;
    return (FloatTextureHandle)
           (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            )__lhs.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
}

Assistant:

FloatTextureHandle FloatTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc,
    bool gpu) {
    FloatTextureHandle tex;
    if (name == "constant")
        tex = FloatConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = FloatScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = FloatMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = FloatBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUFloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
        else
            tex = FloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = FloatCheckerboardTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "dots")
        tex = FloatDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "fbm")
        tex = FBmTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "wrinkled")
        tex = WrinkledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "windy")
        tex = WindyTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = FloatPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: float texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}